

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     ConstantOperation<duckdb::dtime_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<duckdb::dtime_t,false>>
               (QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *state,dtime_t *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  iterator __position;
  dtime_t local_28;
  
  if (count != 0) {
    do {
      local_28 = (dtime_t)input->micros;
      __position._M_current =
           (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
           super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
          super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>::
        _M_realloc_insert<duckdb::dtime_t>
                  ((vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_> *)state,__position,
                   &local_28);
      }
      else {
        (__position._M_current)->micros = local_28.micros;
        (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
        super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}